

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::ParsedIR::set_member_decoration
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration,uint32_t argument)

{
  ulong uVar1;
  Decoration *pDVar2;
  mapped_type *pmVar3;
  ulong new_size;
  ulong uVar4;
  __node_gen_type __node_gen;
  Decoration local_34;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_30;
  
  local_30 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)CONCAT44(local_30._4_4_,id.id);
  pmVar3 = ::std::__detail::
           _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->meta,(key_type *)&local_30);
  uVar1 = (pmVar3->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.buffer_size;
  uVar4 = (ulong)index;
  new_size = uVar4 + 1;
  if (uVar4 + 1 < uVar1) {
    new_size = uVar1;
  }
  SmallVector<diligent_spirv_cross::Meta::Decoration,_0UL>::resize(&pmVar3->members,new_size);
  pDVar2 = (pmVar3->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.ptr;
  if (decoration < 0x40) {
    pDVar2[uVar4].decoration_flags.lower =
         pDVar2[uVar4].decoration_flags.lower | 1L << ((byte)decoration & 0x3f);
  }
  else {
    local_30 = &pDVar2[uVar4].decoration_flags.higher;
    local_34 = decoration;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              (local_30,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                         *)&local_34);
  }
  if ((int)decoration < 0x1d) {
    if (decoration == DecorationSpecId) {
      pDVar2[uVar4].spec_id = argument;
    }
    else if (decoration == DecorationMatrixStride) {
      pDVar2[uVar4].matrix_stride = argument;
    }
    else if (decoration == BuiltIn) {
      pDVar2[uVar4].builtin = true;
      pDVar2[uVar4].builtin_type = argument;
    }
  }
  else {
    switch(decoration) {
    case DecorationStream:
      pDVar2[uVar4].stream = argument;
      break;
    case DecorationLocation:
      pDVar2[uVar4].location = argument;
      break;
    case Component:
      pDVar2[uVar4].component = argument;
      break;
    case DecorationIndex:
      pDVar2[uVar4].index = argument;
      break;
    case Binding:
      pDVar2[uVar4].binding = argument;
      break;
    case DecorationOffset:
      pDVar2[uVar4].offset = argument;
      break;
    case DecorationXfbBuffer:
      pDVar2[uVar4].xfb_buffer = argument;
      break;
    case DecorationXfbStride:
      pDVar2[uVar4].xfb_stride = argument;
    }
  }
  return;
}

Assistant:

void ParsedIR::set_member_decoration(TypeID id, uint32_t index, Decoration decoration, uint32_t argument)
{
	auto &m = meta[id];
	m.members.resize(max(m.members.size(), size_t(index) + 1));
	auto &dec = m.members[index];
	dec.decoration_flags.set(decoration);

	switch (decoration)
	{
	case DecorationBuiltIn:
		dec.builtin = true;
		dec.builtin_type = static_cast<BuiltIn>(argument);
		break;

	case DecorationLocation:
		dec.location = argument;
		break;

	case DecorationComponent:
		dec.component = argument;
		break;

	case DecorationBinding:
		dec.binding = argument;
		break;

	case DecorationOffset:
		dec.offset = argument;
		break;

	case DecorationXfbBuffer:
		dec.xfb_buffer = argument;
		break;

	case DecorationXfbStride:
		dec.xfb_stride = argument;
		break;

	case DecorationStream:
		dec.stream = argument;
		break;

	case DecorationSpecId:
		dec.spec_id = argument;
		break;

	case DecorationMatrixStride:
		dec.matrix_stride = argument;
		break;

	case DecorationIndex:
		dec.index = argument;
		break;

	default:
		break;
	}
}